

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_internal.h
# Opt level: O2

size_t ZSTD_hashPtr(void *p,U32 hBits,U32 mls)

{
  long lVar1;
  
  switch(mls) {
  case 5:
    lVar1 = -0x30e4432345000000;
    break;
  case 6:
    lVar1 = -0x30e4432340650000;
    break;
  case 7:
    lVar1 = -0x30e44323405a9d00;
    break;
  case 8:
    lVar1 = -0x30e44323485a9b9d;
    break;
  default:
    return (ulong)((uint)(*p * -0x61c8864f) >> (-(char)hBits & 0x1fU));
  }
  return (ulong)(lVar1 * *p) >> (-(char)hBits & 0x3fU);
}

Assistant:

MEM_STATIC size_t ZSTD_hashPtr(const void* p, U32 hBits, U32 mls)
{
    switch(mls)
    {
    default:
    case 4: return ZSTD_hash4Ptr(p, hBits);
    case 5: return ZSTD_hash5Ptr(p, hBits);
    case 6: return ZSTD_hash6Ptr(p, hBits);
    case 7: return ZSTD_hash7Ptr(p, hBits);
    case 8: return ZSTD_hash8Ptr(p, hBits);
    }
}